

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O1

DdNode * Cudd_zddIthVar(DdManager *dd,int i)

{
  int *piVar1;
  bool bVar2;
  DdNode **ppDVar3;
  DdNode *pDVar4;
  long lVar5;
  DdNode *pDVar6;
  
  if ((uint)i < 0x7ffffffe) {
    if (i < dd->sizeZ + -1) {
      ppDVar3 = dd->univ + (long)dd->permZ[(uint)i] + 1;
    }
    else {
      ppDVar3 = &dd->one;
    }
    pDVar6 = *ppDVar3;
    do {
      dd->reordered = 0;
      pDVar4 = cuddUniqueInterZdd(dd,i,pDVar6,dd->zero);
    } while (dd->reordered == 1);
    if (pDVar4 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      lVar5 = (long)dd->permZ[(uint)i];
      pDVar6 = pDVar4;
      if (0 < (long)dd->permZ[(uint)i]) {
        do {
          do {
            dd->reordered = 0;
            pDVar4 = cuddUniqueInterZdd(dd,dd->invpermZ[lVar5 + -1],pDVar6,pDVar6);
          } while (dd->reordered == 1);
          if (pDVar4 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,pDVar6);
            return (DdNode *)0x0;
          }
          piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDerefZdd(dd,pDVar6);
          bVar2 = 1 < lVar5;
          lVar5 = lVar5 + -1;
          pDVar6 = pDVar4;
        } while (bVar2);
      }
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      return pDVar4;
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_zddIthVar(
  DdManager * dd,
  int  i)
{
    DdNode *res;
    DdNode *zvar;
    DdNode *lower;
    int j;

    if ((unsigned int) i >= CUDD_MAXINDEX - 1) return(NULL);

    /* The i-th variable function has the following structure:
    ** at the level corresponding to index i there is a node whose "then"
    ** child points to the universe, and whose "else" child points to zero.
    ** Above that level there are nodes with identical children.
    */

    /* First we build the node at the level of index i. */
    lower = (i < dd->sizeZ - 1) ? dd->univ[dd->permZ[i]+1] : DD_ONE(dd);
    do {
        dd->reordered = 0;
        zvar = cuddUniqueInterZdd(dd, i, lower, DD_ZERO(dd));
    } while (dd->reordered == 1);

    if (zvar == NULL)
        return(NULL);
    cuddRef(zvar);

    /* Now we add the "filler" nodes above the level of index i. */
    for (j = dd->permZ[i] - 1; j >= 0; j--) {
        do {
            dd->reordered = 0;
            res = cuddUniqueInterZdd(dd, dd->invpermZ[j], zvar, zvar);
        } while (dd->reordered == 1);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(dd,zvar);
            return(NULL);
        }
        cuddRef(res);
        Cudd_RecursiveDerefZdd(dd,zvar);
        zvar = res;
    }
    cuddDeref(zvar);
    return(zvar);

}